

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExecuteInstruction.cpp
# Opt level: O0

int do_or(void)

{
  uint *puVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  undefined4 *puVar5;
  undefined8 in_RSI;
  uint *R_2;
  uint temp_2;
  int16_t *R_1;
  uint temp_1;
  char *R;
  uint temp;
  uint *Rb_2;
  uint *Ra_2;
  int16_t *Rb_1;
  int16_t *Ra_1;
  char *Rb;
  char *Ra;
  uint8_t highb;
  uint8_t low;
  uint8_t high;
  
  bVar3 = (byte)code_ptr[registe_ptr->IP + 2] / 0x10;
  bVar2 = (byte)code_ptr[registe_ptr->IP + 2] % 0x10;
  if (code_ptr[registe_ptr->IP + 1] == '\0') {
    bVar4 = (byte)code_ptr[registe_ptr->IP + 3] / 0x10;
    if (bVar2 == 0) {
      puVar1 = register_list[bVar3];
      *(byte *)puVar1 = (byte)*puVar1 | (byte)*register_list[bVar4];
      set_flag((byte)*puVar1);
    }
    else if (bVar2 == 1) {
      puVar1 = register_list[bVar3];
      *(ushort *)puVar1 = (ushort)*puVar1 | (ushort)*register_list[bVar4];
      set_flag((ushort)*puVar1);
    }
    else {
      if (bVar2 != 2) {
        puVar5 = (undefined4 *)
                 __cxa_allocate_exception
                           (4,in_RSI,(ulong)(byte)code_ptr[registe_ptr->IP + 3] % 0x10);
        *puVar5 = 0xf6;
        __cxa_throw(puVar5,&int::typeinfo,0);
      }
      puVar1 = register_list[bVar3];
      *puVar1 = *register_list[bVar4] | *puVar1;
      set_flag(*puVar1);
    }
  }
  else {
    if (code_ptr[registe_ptr->IP + 1] != '\x01') {
      puVar5 = (undefined4 *)__cxa_allocate_exception(4);
      *puVar5 = 0xf6;
      __cxa_throw(puVar5,&int::typeinfo,0);
    }
    if (bVar2 == 0) {
      puVar1 = register_list[bVar3];
      *(byte *)puVar1 = (byte)*puVar1 | (byte)*(undefined4 *)(code_ptr + (ulong)registe_ptr->IP + 3)
      ;
      set_flag((byte)*puVar1);
    }
    else if (bVar2 == 1) {
      puVar1 = register_list[bVar3];
      *(ushort *)puVar1 =
           (ushort)*puVar1 | (ushort)*(undefined4 *)(code_ptr + (ulong)registe_ptr->IP + 3);
      set_flag((ushort)*puVar1);
    }
    else {
      if (bVar2 != 2) {
        puVar5 = (undefined4 *)__cxa_allocate_exception(4);
        *puVar5 = 0xf6;
        __cxa_throw(puVar5,&int::typeinfo,0);
      }
      puVar1 = register_list[bVar3];
      *puVar1 = *(uint *)(code_ptr + (ulong)registe_ptr->IP + 3) | *puVar1;
      set_flag(*puVar1);
    }
  }
  return 1;
}

Assistant:

int do_or() {
	uint8_t high = (uint8_t)code_ptr[registe_ptr->IP + 2] / 0x10;
	uint8_t low = (uint8_t)code_ptr[registe_ptr->IP + 2] % 0x10;
	if (code_ptr[registe_ptr->IP + 1] == 0)//0型命令
	{
		uint8_t highb = (uint8_t)code_ptr[registe_ptr->IP + 3] / 0x10;
		if (low == 0) {
			char*Ra = (char *)register_list[high];
			char*Rb = (char*)register_list[highb];
			*Ra |= *Rb;
			set_flag(*Ra);
		}
		else if (low == 1)
		{
			int16_t*Ra = (int16_t *)register_list[high];
			int16_t*Rb = (int16_t *)register_list[highb];
			*Ra |= *Rb;
			set_flag(*Ra);
		}
		else if (low == 2)
		{
			unsigned*Ra = (unsigned *)register_list[high];
			unsigned*Rb = (unsigned*)register_list[highb];
			*Ra |= *Rb;
			set_flag(*Ra);
		}
		else throw(LVM_EXECUTE_ERROR);
	}
	else if (code_ptr[registe_ptr->IP + 1] == 1) {//1型命令
		if (low == 0)//低位运算
		{
			unsigned temp = *(unsigned*)(code_ptr + registe_ptr->IP + 2 + 1);//获得立即数
			char *R = (char *)register_list[high];
			*R |= temp;
			set_flag(*R);
		}
		else if (low == 1)//高位运算
		{
			unsigned temp = *(unsigned*)(code_ptr + registe_ptr->IP + 2 + 1);//获得立即数
			int16_t *R = (int16_t *)register_list[high];
			*R |= temp;
			set_flag(*R);
		}
		else if (low == 2)//全运算
		{
			unsigned temp = *(unsigned*)(code_ptr + registe_ptr->IP + 2 + 1);//获得立即数
			unsigned *R = (unsigned *)register_list[high];
			*R |= temp;
			set_flag(*R);
		}
		else throw(LVM_EXECUTE_ERROR);

	}
	else throw(LVM_EXECUTE_ERROR);
	return LVM_SUCCESS;
}